

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::RangeSink::AddOutput(RangeSink *this,DualMap *map,NameMunger *munger)

{
  pointer *pppVar1;
  iterator __position;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> local_10;
  
  __position._M_current =
       (this->outputs_).
       super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->outputs_).
      super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.first = map;
    local_10.second = munger;
    std::
    vector<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>,std::allocator<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>>
    ::_M_realloc_insert<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>
              ((vector<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>,std::allocator<std::pair<bloaty::DualMap*,bloaty::NameMunger_const*>>>
                *)&this->outputs_,__position,&local_10);
  }
  else {
    (__position._M_current)->first = map;
    (__position._M_current)->second = munger;
    pppVar1 = &(this->outputs_).
               super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void RangeSink::AddOutput(DualMap* map, const NameMunger* munger) {
  outputs_.push_back(std::make_pair(map, munger));
}